

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::input_stream_adapter>
::lexer(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::input_stream_adapter>
        *this,input_stream_adapter *adapter)

{
  char cVar1;
  int_type iVar2;
  input_stream_adapter *in_RSI;
  input_stream_adapter *in_RDI;
  
  input_stream_adapter::input_stream_adapter(in_RDI,in_RSI);
  iVar2 = std::char_traits<char>::eof();
  *(int_type *)&in_RDI[1].is = iVar2;
  *(undefined1 *)((long)&in_RDI[1].is + 4) = 0;
  in_RDI[1].sb = (streambuf *)0x0;
  in_RDI[2].is = (istream *)0x0;
  in_RDI[2].sb = (streambuf *)0x0;
  memset(in_RDI + 3,0,0x18);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x1681aa);
  std::__cxx11::string::string((string *)&in_RDI[4].sb);
  in_RDI[6].sb = (streambuf *)0x355fd7;
  in_RDI[7].is = (istream *)0x0;
  in_RDI[7].sb = (streambuf *)0x0;
  in_RDI[8].is = (istream *)0x0;
  cVar1 = get_decimal_point();
  *(char *)&in_RDI[8].sb = cVar1;
  return;
}

Assistant:

explicit lexer(InputAdapterType&& adapter)
        : ia(std::move(adapter)), decimal_point_char(get_decimal_point()) {}